

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int __thiscall jrtplib::RTPUDPv4Transmitter::Poll(RTPUDPv4Transmitter *this)

{
  int local_1c;
  int status;
  RTPUDPv4Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x5a;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x59;
  }
  else {
    local_1c = PollSocket(this,true);
    if ((this->rtpsock != this->rtcpsock) && (-1 < local_1c)) {
      local_1c = PollSocket(this,false);
    }
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv4Transmitter::Poll()
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;

	int status;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	status = PollSocket(true); // poll RTP socket
	if (rtpsock != rtcpsock) // no need to poll twice when multiplexing
	{
		if (status >= 0)
			status = PollSocket(false); // poll RTCP socket
	}
	MAINMUTEX_UNLOCK
	return status;
}